

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_r * parse_arguments_expression(gravity_parser_t *parser)

{
  size_t sVar1;
  gtoken_s token;
  gtoken_s token_00;
  gtoken_s token_01;
  gravity_lexer_t *parser_00;
  gtoken_t gVar2;
  gnode_t **ppgVar3;
  gnode_t *pgVar4;
  gnode_t *local_120;
  size_t local_118;
  size_t local_110;
  gnode_t *local_100;
  size_t local_f8;
  gnode_t *local_f0;
  size_t local_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  char *local_c0;
  gnode_t *local_b8;
  gnode_t *expr;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  char *local_40;
  gtoken_t local_38;
  int local_34;
  gtoken_t peek;
  uint32_t index;
  gnode_r *list;
  gravity_lexer_t *pgStack_20;
  _Bool arg_expected;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  pgStack_20 = parser->lexer->p[parser->lexer->n - 1];
  lexer = (gravity_lexer_t *)parser;
  gVar2 = gravity_lexer_peek(pgStack_20);
  if (gVar2 == TOK_OP_CLOSED_PARENTHESIS) {
    return (gnode_r *)0x0;
  }
  list._7_1_ = 1;
  _peek = gnode_array_create();
  local_34 = 0;
  do {
    local_38 = gravity_lexer_peek(pgStack_20);
    parser_00 = lexer;
    if (local_38 == TOK_OP_COMMA) {
      if (_peek->n == _peek->m) {
        if (_peek->m == 0) {
          local_e8 = 8;
        }
        else {
          local_e8 = _peek->m << 1;
        }
        _peek->m = local_e8;
        ppgVar3 = (gnode_t **)realloc(_peek->p,_peek->m << 3);
        _peek->p = ppgVar3;
      }
      memset(&local_60,0,0x28);
      local_60 = 0x28;
      if (**(long **)&lexer->offset == 0) {
        local_f0 = (gnode_t *)0x0;
      }
      else {
        local_f0 = *(gnode_t **)
                    (*(long *)(*(long *)&lexer->offset + 0x10) +
                    (**(long **)&lexer->offset + -1) * 8);
      }
      token.lineno = uStack_5c;
      token.type = 0x28;
      token.colno = (int)uStack_58;
      token.position = (int)((ulong)uStack_58 >> 0x20);
      token.bytes = (int)local_50;
      token.length = (int)((ulong)local_50 >> 0x20);
      token.fileid = (int)uStack_48;
      token.builtin = (int)((ulong)uStack_48 >> 0x20);
      token.value = local_40;
      pgVar4 = gnode_keyword_expr_create(token,local_f0);
      sVar1 = _peek->n;
      _peek->n = sVar1 + 1;
      _peek->p[sVar1] = pgVar4;
      list._7_1_ = 1;
      gravity_lexer_next(pgStack_20);
      gVar2 = gravity_lexer_peek(pgStack_20);
      if (gVar2 == TOK_OP_CLOSED_PARENTHESIS) {
        if (_peek->n == _peek->m) {
          if (_peek->m == 0) {
            local_f8 = 8;
          }
          else {
            local_f8 = _peek->m << 1;
          }
          _peek->m = local_f8;
          ppgVar3 = (gnode_t **)realloc(_peek->p,_peek->m << 3);
          _peek->p = ppgVar3;
        }
        memset(&local_88,0,0x28);
        local_88 = 0x28;
        if (**(long **)&lexer->offset == 0) {
          local_100 = (gnode_t *)0x0;
        }
        else {
          local_100 = *(gnode_t **)
                       (*(long *)(*(long *)&lexer->offset + 0x10) +
                       (**(long **)&lexer->offset + -1) * 8);
        }
        token_00.lineno = uStack_84;
        token_00.type = 0x28;
        token_00.colno = (int)uStack_80;
        token_00.position = (int)((ulong)uStack_80 >> 0x20);
        token_00.bytes = (int)local_78;
        token_00.length = (int)((ulong)local_78 >> 0x20);
        token_00.fileid = (int)uStack_70;
        token_00.builtin = (int)((ulong)uStack_70 >> 0x20);
        token_00.value = local_68;
        pgVar4 = gnode_keyword_expr_create(token_00,local_100);
        sVar1 = _peek->n;
        _peek->n = sVar1 + 1;
        _peek->p[sVar1] = pgVar4;
      }
    }
    else {
      if ((local_38 == TOK_EOF) || (local_38 == TOK_OP_CLOSED_PARENTHESIS)) {
        return _peek;
      }
      if ((list._7_1_ & 1) == 0) {
        gravity_lexer_token_next((gtoken_s *)&expr,pgStack_20);
        report_error((gravity_parser_t *)parser_00,GRAVITY_ERROR_SYNTAX,0x170bfc);
        return _peek;
      }
      local_b8 = parse_expression((gravity_parser_t *)lexer);
      if (local_b8 != (gnode_t *)0x0) {
        if (_peek->n == _peek->m) {
          if (_peek->m == 0) {
            local_110 = 8;
          }
          else {
            local_110 = _peek->m << 1;
          }
          _peek->m = local_110;
          ppgVar3 = (gnode_t **)realloc(_peek->p,_peek->m << 3);
          _peek->p = ppgVar3;
        }
        sVar1 = _peek->n;
        _peek->n = sVar1 + 1;
        _peek->p[sVar1] = local_b8;
      }
      local_38 = gravity_lexer_peek(pgStack_20);
      if (local_38 == TOK_OP_COMMA) {
        gravity_lexer_next(pgStack_20);
        gVar2 = gravity_lexer_peek(pgStack_20);
        if (gVar2 == TOK_OP_CLOSED_PARENTHESIS) {
          if (_peek->n == _peek->m) {
            if (_peek->m == 0) {
              local_118 = 8;
            }
            else {
              local_118 = _peek->m << 1;
            }
            _peek->m = local_118;
            ppgVar3 = (gnode_t **)realloc(_peek->p,_peek->m << 3);
            _peek->p = ppgVar3;
          }
          memset(&local_e0,0,0x28);
          local_e0 = 0x28;
          if (**(long **)&lexer->offset == 0) {
            local_120 = (gnode_t *)0x0;
          }
          else {
            local_120 = *(gnode_t **)
                         (*(long *)(*(long *)&lexer->offset + 0x10) +
                         (**(long **)&lexer->offset + -1) * 8);
          }
          token_01.lineno = uStack_dc;
          token_01.type = 0x28;
          token_01.colno = (int)uStack_d8;
          token_01.position = (int)((ulong)uStack_d8 >> 0x20);
          token_01.bytes = (int)local_d0;
          token_01.length = (int)((ulong)local_d0 >> 0x20);
          token_01.fileid = (int)uStack_c8;
          token_01.builtin = (int)((ulong)uStack_c8 >> 0x20);
          token_01.value = local_c0;
          pgVar4 = gnode_keyword_expr_create(token_01,local_120);
          sVar1 = _peek->n;
          _peek->n = sVar1 + 1;
          _peek->p[sVar1] = pgVar4;
        }
      }
      list._7_1_ = local_38 == TOK_OP_COMMA;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static gnode_r *parse_arguments_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_arguments_expression");
    DECLARE_LEXER;

    // it's OK for a call_expression_list to be empty
    if (gravity_lexer_peek(lexer) == TOK_OP_CLOSED_PARENTHESIS) return NULL;

    // https://en.wikipedia.org/wiki/Named_parameter
    // with the introduction of named parameters there are a lot
    // of sub-cases to handle here, for example I cannot know in
    // advance if a call has named parameters or not from the
    // beginning because we also support mixed calls (both position
    // and named parameters)
    // so basically I collect two arrays here
    // one for names (or positions) and one for values
    // if the call is not a named call then the useless
    // array is discarded
    
    bool arg_expected = true;
    gnode_r *list = gnode_array_create();

    uint32_t index = 0;
    while (1) {
        gtoken_t peek = gravity_lexer_peek(lexer);

        if (peek == TOK_OP_COMMA) {
            // added the ability to convert ,, to ,undefined,
            gnode_array_push(list, gnode_keyword_expr_create(UNDEF_TOKEN, LAST_DECLARATION()));
            arg_expected = true;

            // consume next TOK_OP_COMMA and check for special ,) case
            gravity_lexer_next(lexer);
            if (gravity_lexer_peek(lexer) == TOK_OP_CLOSED_PARENTHESIS)
                gnode_array_push(list, gnode_keyword_expr_create(UNDEF_TOKEN, LAST_DECLARATION()));

        } else {
            // check exit condition
            if ((peek == TOK_EOF) || (peek == TOK_OP_CLOSED_PARENTHESIS))
                break;

            // I am going to parse and expression but is it allowed?
            if (!arg_expected) {
                REPORT_ERROR(gravity_lexer_token_next(lexer), "Missing , in function call.");
                return list;
            }

            // parse expression
            gnode_t *expr = parse_expression(parser);
            if (expr) gnode_array_push(list, expr);

            // consume next TOK_OP_COMMA and check for special ,) case
            peek = gravity_lexer_peek(lexer);
            if (peek == TOK_OP_COMMA) {
                gravity_lexer_next(lexer);
                if (gravity_lexer_peek(lexer) == TOK_OP_CLOSED_PARENTHESIS)
                    gnode_array_push(list, gnode_keyword_expr_create(UNDEF_TOKEN, LAST_DECLARATION()));
            }

            // arg is expected only if a comma is consumed
            // this fixes syntax errors like System.print("Hello" " World")
            arg_expected = (peek == TOK_OP_COMMA);
        }
        
        ++index;
    }

    return list;
}